

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::Response<capnp::AnyPointer>_> * __thiscall
kj::_::ExceptionOr<capnp::Response<capnp::AnyPointer>_>::operator=
          (ExceptionOr<capnp::Response<capnp::AnyPointer>_> *this,
          ExceptionOr<capnp::Response<capnp::AnyPointer>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<capnp::Response<capnp::AnyPointer>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;